

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsComplex helicsInputGetComplexObject(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  HelicsComplex HVar3;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  dVar2 = -1.785e+39;
  if (pIVar1 == (InputObject *)0x0) {
    in_XMM1_Qa = -1.785e+39;
  }
  else {
    helics::Input::getValue_impl<std::complex<double>>(pIVar1->inputPtr);
    dVar2 = extraout_XMM0_Qa;
  }
  HVar3.imag = in_XMM1_Qa;
  HVar3.real = dVar2;
  return HVar3;
}

Assistant:

HelicsComplex helicsInputGetComplexObject(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);

    if (inpObj == nullptr) {
        // time invalid is just an invalid double
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }

    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        return {cval.real(), cval.imag()};
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }
    // LCOV_EXCL_STOP
}